

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O3

int Eigen::internal::find_ordering<int>
              (int n_row,int n_col,int Alen,Colamd_Row<int> *Row,colamd_col<int> *Col,int *A,
              int *head,int n_col2,int max_deg,int pfree)

{
  colamd_col<int> *pcVar1;
  colamd_col<int> *pcVar2;
  colamd_col<int> *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  anon_union_4_3_eabe2f71_for_shared3 aVar7;
  int iVar8;
  long in_RAX;
  int *piVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  anon_union_4_3_eabe2f71_for_shared3 *paVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  anon_union_4_2_db423fdf_for_shared4 *paVar20;
  uint uVar21;
  int *piVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  anon_union_4_2_a9a27649_for_shared2 *paVar27;
  int *piVar28;
  int iVar29;
  anon_union_4_2_a9a27649_for_shared2 *paVar30;
  int *local_70;
  int *rp_end;
  int *local_60;
  int local_48;
  int local_44;
  int local_3c;
  int local_34;
  
  if (0 < n_row) {
    in_RAX = (ulong)(uint)n_row << 4;
    lVar12 = 0;
    do {
      if (-1 < *(int *)((long)&Row->shared2 + lVar12)) {
        *(undefined4 *)((long)&Row->shared2 + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while (in_RAX != lVar12);
  }
  local_48 = (int)in_RAX;
  if (0 < n_col2) {
    local_34 = pfree;
    lVar12 = (ulong)(uint)n_row << 4;
    iVar10 = 1;
    iVar24 = 0;
    local_48 = 0;
    do {
      iVar23 = local_48 + -1;
      lVar25 = (long)local_48;
      do {
        lVar14 = lVar25;
        iVar8 = head[lVar14];
        iVar23 = iVar23 + 1;
        if (n_col <= lVar14) break;
        lVar25 = lVar14 + 1;
      } while (iVar8 == -1);
      iVar29 = Col[iVar8].shared4.degree_next;
      head[lVar14] = iVar29;
      if ((long)iVar29 != -1) {
        Col[iVar29].shared3.headhash = -1;
      }
      pcVar1 = Col + iVar8;
      iVar8 = (pcVar1->shared1).thickness;
      iVar29 = (pcVar1->shared2).score;
      (pcVar1->shared2).score = iVar24;
      iVar24 = iVar24 + iVar8;
      iVar11 = n_col - iVar24;
      if (iVar29 < n_col - iVar24) {
        iVar11 = iVar29;
      }
      iVar29 = local_34;
      if (Alen <= iVar11 + local_34) {
        paVar27 = (anon_union_4_2_a9a27649_for_shared2 *)A;
        if (0 < n_col) {
          uVar13 = 0;
          do {
            uVar21 = Col[uVar13].start;
            if (-1 < (int)uVar21) {
              pcVar2 = Col + uVar13;
              uVar26 = (ulong)((long)paVar27 - (long)A) >> 2;
              pcVar2->start = (int)uVar26;
              iVar10 = pcVar2->length;
              if (0 < iVar10) {
                lVar25 = 0;
                do {
                  if (-1 < Row[A[(ulong)uVar21 + lVar25]].shared2.mark) {
                    paVar27->mark = A[(ulong)uVar21 + lVar25];
                    paVar27 = paVar27 + 1;
                  }
                  lVar25 = lVar25 + 1;
                } while (iVar10 != (int)lVar25);
                uVar26 = (ulong)(uint)pcVar2->start;
              }
              pcVar2->length = (int)((ulong)((long)paVar27 - (long)(A + uVar26)) >> 2);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != (uint)n_col);
        }
        if (0 < n_row) {
          iVar10 = -1;
          lVar25 = 0;
          do {
            if (-1 < *(int *)((long)&Row->shared2 + lVar25)) {
              if (*(int *)((long)&Row->length + lVar25) == 0) {
                *(undefined4 *)((long)&Row->shared2 + lVar25) = 0xffffffff;
              }
              else {
                iVar29 = *(int *)((long)&Row->start + lVar25);
                *(int *)((long)&Row->shared2 + lVar25) = A[iVar29];
                A[iVar29] = iVar10;
              }
            }
            iVar10 = iVar10 + -1;
            lVar25 = lVar25 + 0x10;
          } while (lVar12 != lVar25);
        }
        paVar30 = paVar27;
        while (paVar27 < (anon_union_4_2_a9a27649_for_shared2 *)(A + local_34)) {
          if (paVar27->mark < 0) {
            uVar21 = ~paVar27->mark;
            *paVar27 = Row[uVar21].shared2;
            uVar13 = (ulong)((long)paVar30 - (long)A) >> 2;
            Row[uVar21].start = (int)uVar13;
            iVar10 = Row[uVar21].length;
            if (0 < iVar10) {
              do {
                if (-1 < Col[paVar27->mark].start) {
                  paVar30->mark = paVar27->mark;
                  paVar30 = paVar30 + 1;
                }
                paVar27 = paVar27 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
              uVar13 = (ulong)(uint)Row[uVar21].start;
            }
            Row[uVar21].length = (int)((ulong)((long)paVar30 - (long)(A + uVar13)) >> 2);
          }
          else {
            paVar27 = paVar27 + 1;
          }
        }
        iVar29 = (int)((ulong)((long)paVar30 - (long)A) >> 2);
        iVar10 = 1;
        if (0 < n_row) {
          lVar25 = 0;
          do {
            if (-1 < *(int *)((long)&Row->shared2 + lVar25)) {
              *(undefined4 *)((long)&Row->shared2 + lVar25) = 0;
            }
            lVar25 = lVar25 + 0x10;
          } while (lVar12 != lVar25);
        }
      }
      (pcVar1->shared1).thickness = -iVar8;
      piVar9 = A + pcVar1->start;
      piVar16 = piVar9 + pcVar1->length;
      local_3c = 0;
      local_34 = iVar29;
      while (piVar9 < piVar16) {
        iVar11 = *piVar9;
        piVar9 = piVar9 + 1;
        if (-1 < Row[iVar11].shared2.mark) {
          lVar25 = (long)Row[iVar11].length;
          if (0 < lVar25) {
            piVar22 = A + Row[iVar11].start;
            piVar28 = piVar22 + lVar25;
            do {
              iVar11 = *piVar22;
              iVar17 = Col[iVar11].shared1.thickness;
              if ((0 < iVar17) && (-1 < Col[iVar11].start)) {
                Col[iVar11].shared1.thickness = -iVar17;
                lVar25 = (long)local_34;
                local_34 = local_34 + 1;
                A[lVar25] = iVar11;
                local_3c = local_3c + iVar17;
              }
              piVar22 = piVar22 + 1;
            } while (piVar22 < piVar28);
          }
        }
      }
      (pcVar1->shared1).thickness = iVar8;
      if (max_deg <= local_3c) {
        max_deg = local_3c;
      }
      if (0 < (long)pcVar1->length) {
        piVar9 = A + pcVar1->start;
        piVar16 = piVar9 + pcVar1->length;
        do {
          iVar8 = *piVar9;
          piVar9 = piVar9 + 1;
          Row[iVar8].shared2.mark = -1;
        } while (piVar9 < piVar16);
      }
      uVar21 = local_34 - iVar29;
      if (uVar21 == 0 || local_34 < iVar29) {
        local_60 = A + iVar29;
        local_70 = local_60 + (int)uVar21;
        local_44 = -1;
      }
      else {
        local_44 = A[pcVar1->start];
        local_60 = A + iVar29;
        local_70 = local_60 + uVar21;
        piVar9 = local_60;
        do {
          pcVar2 = Col + *piVar9;
          iVar8 = (pcVar2->shared1).thickness;
          iVar11 = (pcVar2->shared4).degree_next;
          (pcVar2->shared1).thickness = -iVar8;
          iVar17 = (pcVar2->shared3).headhash;
          if ((long)iVar17 == -1) {
            paVar20 = (anon_union_4_2_db423fdf_for_shared4 *)(head + (pcVar2->shared2).score);
          }
          else {
            paVar20 = &Col[iVar17].shared4;
          }
          paVar20->degree_next = iVar11;
          if (iVar11 != -1) {
            Col[iVar11].shared3.headhash = iVar17;
          }
          if (0 < (long)pcVar2->length) {
            piVar16 = A + pcVar2->start;
            piVar22 = piVar16 + pcVar2->length;
            do {
              iVar11 = *piVar16;
              if (-1 < Row[iVar11].shared2.mark) {
                iVar17 = Row[iVar11].shared2.mark - iVar10;
                if (iVar17 < 0) {
                  iVar17 = Row[iVar11].shared1.degree;
                }
                iVar17 = iVar17 + iVar8;
                Row[iVar11].shared2.mark = -(uint)(iVar17 == 0) | iVar17 + iVar10;
              }
              piVar16 = piVar16 + 1;
            } while (piVar16 < piVar22);
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 < local_70);
        piVar9 = local_60;
        if (0 < (int)uVar21) {
          do {
            iVar8 = *piVar9;
            pcVar2 = Col + iVar8;
            piVar16 = A + pcVar2->start;
            piVar22 = piVar16 + pcVar2->length;
            uVar6 = 0;
            piVar28 = piVar16;
            iVar11 = 0;
            while (piVar28 < piVar22) {
              iVar17 = *piVar28;
              piVar28 = piVar28 + 1;
              iVar18 = Row[iVar17].shared2.mark;
              if (-1 < iVar18) {
                *piVar16 = iVar17;
                piVar16 = piVar16 + 1;
                uVar6 = uVar6 + iVar17;
                iVar11 = (iVar11 - iVar10) + iVar18;
                if (n_col <= iVar11) {
                  iVar11 = n_col;
                }
              }
            }
            iVar17 = (int)((ulong)((long)piVar16 - (long)(A + (uint)pcVar2->start)) >> 2);
            pcVar2->length = iVar17;
            if (iVar17 == 0) {
              pcVar2->start = -1;
              local_3c = local_3c - (pcVar2->shared1).thickness;
              (pcVar2->shared2).score = iVar24;
              iVar24 = iVar24 + (pcVar2->shared1).thickness;
            }
            else {
              (pcVar2->shared2).score = iVar11;
              uVar13 = (ulong)uVar6 % (ulong)(n_col + 1);
              lVar25 = (long)head[uVar13];
              if (lVar25 < 0) {
                aVar7.headhash = -2 - head[uVar13];
                head[uVar13] = -2 - iVar8;
              }
              else {
                aVar7 = Col[lVar25].shared3;
                Col[lVar25].shared3.headhash = iVar8;
              }
              pcVar2->shared4 = (anon_union_4_2_db423fdf_for_shared4)aVar7;
              (pcVar2->shared3).headhash = (int)uVar13;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 < local_70);
          piVar9 = local_60;
          if (0 < (int)uVar21) {
            do {
              if (-1 < Col[*piVar9].start) {
                iVar8 = Col[*piVar9].shared3.headhash;
                iVar11 = head[iVar8];
                lVar25 = (long)iVar11;
                if (lVar25 < 0) {
                  iVar17 = -2 - iVar11;
                }
                else {
                  iVar17 = Col[lVar25].shared3.headhash;
                }
                while (iVar17 != -1) {
                  iVar18 = Col[iVar17].shared4.degree_next;
                  if (iVar18 == -1) break;
                  pcVar2 = Col + iVar17;
                  iVar4 = pcVar2->length;
                  iVar5 = iVar17;
                  do {
                    pcVar3 = Col + iVar18;
                    iVar19 = iVar18;
                    if ((pcVar3->length == iVar4) &&
                       ((pcVar3->shared2).score == (pcVar2->shared2).score)) {
                      if (iVar4 < 1) {
                        lVar14 = 0;
LAB_0016435d:
                        if ((int)lVar14 != iVar4) goto LAB_00164394;
                      }
                      else {
                        lVar14 = 0;
                        do {
                          if (A[pcVar2->start + lVar14] != A[pcVar3->start + lVar14])
                          goto LAB_0016435d;
                          lVar14 = lVar14 + 1;
                        } while (iVar4 != (int)lVar14);
                      }
                      (pcVar2->shared1).thickness =
                           (pcVar2->shared1).thickness + (pcVar3->shared1).thickness;
                      (pcVar3->shared1).thickness = iVar17;
                      pcVar3->start = -2;
                      (pcVar3->shared2).score = -1;
                      Col[iVar5].shared4 = pcVar3->shared4;
                      iVar19 = iVar5;
                    }
LAB_00164394:
                    iVar18 = (pcVar3->shared4).degree_next;
                    iVar5 = iVar19;
                  } while (iVar18 != -1);
                  iVar17 = (pcVar2->shared4).degree_next;
                }
                paVar15 = &Col[lVar25].shared3;
                if (iVar11 < 0) {
                  paVar15 = (anon_union_4_3_eabe2f71_for_shared3 *)(head + iVar8);
                }
                paVar15->headhash = -1;
              }
              piVar9 = piVar9 + 1;
            } while (piVar9 < local_70);
          }
        }
      }
      iVar8 = max_deg + iVar10 + 1;
      iVar10 = 1;
      if (iVar8 < (int)(n_col ^ 0x7fffffffU)) {
        iVar10 = iVar8;
      }
      pcVar1->start = -1;
      piVar9 = local_60;
      piVar16 = local_60;
      if ((0 < n_row) && ((int)(n_col ^ 0x7fffffffU) <= iVar8)) {
        lVar25 = 0;
        do {
          if (-1 < *(int *)((long)&Row->shared2 + lVar25)) {
            *(undefined4 *)((long)&Row->shared2 + lVar25) = 0;
          }
          lVar25 = lVar25 + 0x10;
        } while (lVar12 != lVar25);
        iVar10 = 1;
      }
      while (local_48 = iVar23, piVar16 < local_70) {
        iVar8 = *piVar16;
        piVar16 = piVar16 + 1;
        iVar23 = local_48;
        if (-1 < Col[iVar8].start) {
          pcVar1 = Col + iVar8;
          *piVar9 = iVar8;
          iVar23 = pcVar1->length;
          pcVar1->length = iVar23 + 1;
          A[(long)pcVar1->start + (long)iVar23] = local_44;
          iVar11 = n_col - (iVar24 + (pcVar1->shared1).thickness);
          iVar23 = ((pcVar1->shared2).score + local_3c) - (pcVar1->shared1).thickness;
          if (iVar11 <= iVar23) {
            iVar23 = iVar11;
          }
          (pcVar1->shared2).score = iVar23;
          iVar11 = head[iVar23];
          (pcVar1->shared4).degree_next = iVar11;
          (pcVar1->shared3).headhash = -1;
          if ((long)iVar11 != -1) {
            Col[iVar11].shared3.headhash = iVar8;
          }
          piVar9 = piVar9 + 1;
          head[iVar23] = iVar8;
          if (local_48 < iVar23) {
            iVar23 = local_48;
          }
        }
      }
      if (0 < local_3c) {
        lVar25 = (long)local_44;
        Row[lVar25].start = iVar29;
        Row[lVar25].length = (int)((ulong)((long)piVar9 - (long)local_60) >> 2);
        Row[lVar25].shared1.degree = local_3c;
        Row[lVar25].shared2.mark = 0;
      }
    } while (iVar24 < n_col2);
  }
  return local_48;
}

Assistant:

static Index find_ordering /* return the number of garbage collections */
  (
    /* === Parameters ======================================================= */

    Index n_row,      /* number of rows of A */
    Index n_col,      /* number of columns of A */
    Index Alen,     /* size of A, 2*nnz + n_col or larger */
    Colamd_Row<Index> Row [],    /* of size n_row+1 */
    colamd_col<Index> Col [],    /* of size n_col+1 */
    Index A [],     /* column form and row form of A */
    Index head [],    /* of size n_col+1 */
    Index n_col2,     /* Remaining columns to order */
    Index max_deg,    /* Maximum row degree */
    Index pfree     /* index of first free slot (2*nnz on entry) */
    )
{
  /* === Local variables ================================================== */

  Index k ;     /* current pivot ordering step */
  Index pivot_col ;   /* current pivot column */
  Index *cp ;     /* a column pointer */
  Index *rp ;     /* a row pointer */
  Index pivot_row ;   /* current pivot row */
  Index *new_cp ;   /* modified column pointer */
  Index *new_rp ;   /* modified row pointer */
  Index pivot_row_start ; /* pointer to start of pivot row */
  Index pivot_row_degree ;  /* number of columns in pivot row */
  Index pivot_row_length ;  /* number of supercolumns in pivot row */
  Index pivot_col_score ; /* score of pivot column */
  Index needed_memory ;   /* free space needed for pivot row */
  Index *cp_end ;   /* pointer to the end of a column */
  Index *rp_end ;   /* pointer to the end of a row */
  Index row ;     /* a row index */
  Index col ;     /* a column index */
  Index max_score ;   /* maximum possible score */
  Index cur_score ;   /* score of current column */
  unsigned int hash ;   /* hash value for supernode detection */
  Index head_column ;   /* head of hash bucket */
  Index first_col ;   /* first column in hash bucket */
  Index tag_mark ;    /* marker value for mark array */
  Index row_mark ;    /* Row [row].shared2.mark */
  Index set_difference ;  /* set difference size of row with pivot row */
  Index min_score ;   /* smallest column score */
  Index col_thickness ;   /* "thickness" (no. of columns in a supercol) */
  Index max_mark ;    /* maximum value of tag_mark */
  Index pivot_col_thickness ; /* number of columns represented by pivot col */
  Index prev_col ;    /* Used by Dlist operations. */
  Index next_col ;    /* Used by Dlist operations. */
  Index ngarbage ;    /* number of garbage collections performed */


  /* === Initialization and clear mark ==================================== */

  max_mark = INT_MAX - n_col ;  /* INT_MAX defined in <limits.h> */
  tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
  min_score = 0 ;
  ngarbage = 0 ;
  COLAMD_DEBUG1 (("colamd: Ordering, n_col2=%d\n", n_col2)) ;

  /* === Order the columns ================================================ */

  for (k = 0 ; k < n_col2 ; /* 'k' is incremented below */)
  {

    /* === Select pivot column, and order it ============================ */

    /* make sure degree list isn't empty */
    COLAMD_ASSERT (min_score >= 0) ;
    COLAMD_ASSERT (min_score <= n_col) ;
    COLAMD_ASSERT (head [min_score] >= COLAMD_EMPTY) ;

    /* get pivot column from head of minimum degree list */
    while (head [min_score] == COLAMD_EMPTY && min_score < n_col)
    {
      min_score++ ;
    }
    pivot_col = head [min_score] ;
    COLAMD_ASSERT (pivot_col >= 0 && pivot_col <= n_col) ;
    next_col = Col [pivot_col].shared4.degree_next ;
    head [min_score] = next_col ;
    if (next_col != COLAMD_EMPTY)
    {
      Col [next_col].shared3.prev = COLAMD_EMPTY ;
    }

    COLAMD_ASSERT (COL_IS_ALIVE (pivot_col)) ;
    COLAMD_DEBUG3 (("Pivot col: %d\n", pivot_col)) ;

    /* remember score for defrag check */
    pivot_col_score = Col [pivot_col].shared2.score ;

    /* the pivot column is the kth column in the pivot order */
    Col [pivot_col].shared2.order = k ;

    /* increment order count by column thickness */
    pivot_col_thickness = Col [pivot_col].shared1.thickness ;
    k += pivot_col_thickness ;
    COLAMD_ASSERT (pivot_col_thickness > 0) ;

    /* === Garbage_collection, if necessary ============================= */

    needed_memory = COLAMD_MIN (pivot_col_score, n_col - k) ;
    if (pfree + needed_memory >= Alen)
    {
      pfree = Eigen::internal::garbage_collection (n_row, n_col, Row, Col, A, &A [pfree]) ;
      ngarbage++ ;
      /* after garbage collection we will have enough */
      COLAMD_ASSERT (pfree + needed_memory < Alen) ;
      /* garbage collection has wiped out the Row[].shared2.mark array */
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;

    }

    /* === Compute pivot row pattern ==================================== */

    /* get starting location for this new merged row */
    pivot_row_start = pfree ;

    /* initialize new row counts to zero */
    pivot_row_degree = 0 ;

    /* tag pivot column as having been visited so it isn't included */
    /* in merged pivot row */
    Col [pivot_col].shared1.thickness = -pivot_col_thickness ;

    /* pivot row is the union of all rows in the pivot column pattern */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* get a row */
      row = *cp++ ;
      COLAMD_DEBUG4 (("Pivot col pattern %d %d\n", ROW_IS_ALIVE (row), row)) ;
      /* skip if row is dead */
      if (ROW_IS_DEAD (row))
      {
	continue ;
      }
      rp = &A [Row [row].start] ;
      rp_end = rp + Row [row].length ;
      while (rp < rp_end)
      {
	/* get a column */
	col = *rp++ ;
	/* add the column, if alive and untagged */
	col_thickness = Col [col].shared1.thickness ;
	if (col_thickness > 0 && COL_IS_ALIVE (col))
	{
	  /* tag column in pivot row */
	  Col [col].shared1.thickness = -col_thickness ;
	  COLAMD_ASSERT (pfree < Alen) ;
	  /* place column in pivot row */
	  A [pfree++] = col ;
	  pivot_row_degree += col_thickness ;
	}
      }
    }

    /* clear tag on pivot column */
    Col [pivot_col].shared1.thickness = pivot_col_thickness ;
    max_deg = COLAMD_MAX (max_deg, pivot_row_degree) ;


    /* === Kill all rows used to construct pivot row ==================== */

    /* also kill pivot row, temporarily */
    cp = &A [Col [pivot_col].start] ;
    cp_end = cp + Col [pivot_col].length ;
    while (cp < cp_end)
    {
      /* may be killing an already dead row */
      row = *cp++ ;
      COLAMD_DEBUG3 (("Kill row in pivot col: %d\n", row)) ;
      KILL_ROW (row) ;
    }

    /* === Select a row index to use as the new pivot row =============== */

    pivot_row_length = pfree - pivot_row_start ;
    if (pivot_row_length > 0)
    {
      /* pick the "pivot" row arbitrarily (first row in col) */
      pivot_row = A [Col [pivot_col].start] ;
      COLAMD_DEBUG3 (("Pivotal row is %d\n", pivot_row)) ;
    }
    else
    {
      /* there is no pivot row, since it is of zero length */
      pivot_row = COLAMD_EMPTY ;
      COLAMD_ASSERT (pivot_row_length == 0) ;
    }
    COLAMD_ASSERT (Col [pivot_col].length > 0 || pivot_row_length == 0) ;

    /* === Approximate degree computation =============================== */

    /* Here begins the computation of the approximate degree.  The column */
    /* score is the sum of the pivot row "length", plus the size of the */
    /* set differences of each row in the column minus the pattern of the */
    /* pivot row itself.  The column ("thickness") itself is also */
    /* excluded from the column score (we thus use an approximate */
    /* external degree). */

    /* The time taken by the following code (compute set differences, and */
    /* add them up) is proportional to the size of the data structure */
    /* being scanned - that is, the sum of the sizes of each column in */
    /* the pivot row.  Thus, the amortized time to compute a column score */
    /* is proportional to the size of that column (where size, in this */
    /* context, is the column "length", or the number of row indices */
    /* in that column).  The number of row indices in a column is */
    /* monotonically non-decreasing, from the length of the original */
    /* column on input to colamd. */

    /* === Compute set differences ====================================== */

    COLAMD_DEBUG3 (("** Computing set differences phase. **\n")) ;

    /* pivot row is currently dead - it will be revived later. */

    COLAMD_DEBUG3 (("Pivot row: ")) ;
    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      COLAMD_DEBUG3 (("Col: %d\n", col)) ;

      /* clear tags used to construct pivot row pattern */
      col_thickness = -Col [col].shared1.thickness ;
      COLAMD_ASSERT (col_thickness > 0) ;
      Col [col].shared1.thickness = col_thickness ;

      /* === Remove column from degree list =========================== */

      cur_score = Col [col].shared2.score ;
      prev_col = Col [col].shared3.prev ;
      next_col = Col [col].shared4.degree_next ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= COLAMD_EMPTY) ;
      if (prev_col == COLAMD_EMPTY)
      {
	head [cur_score] = next_col ;
      }
      else
      {
	Col [prev_col].shared4.degree_next = next_col ;
      }
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = prev_col ;
      }

      /* === Scan the column ========================================== */

      cp = &A [Col [col].start] ;
      cp_end = cp + Col [col].length ;
      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row != pivot_row) ;
	set_difference = row_mark - tag_mark ;
	/* check if the row has been seen yet */
	if (set_difference < 0)
	{
	  COLAMD_ASSERT (Row [row].shared1.degree <= max_deg) ;
	  set_difference = Row [row].shared1.degree ;
	}
	/* subtract column thickness from this row's set difference */
	set_difference -= col_thickness ;
	COLAMD_ASSERT (set_difference >= 0) ;
	/* absorb this row if the set difference becomes zero */
	if (set_difference == 0)
	{
	  COLAMD_DEBUG3 (("aggressive absorption. Row: %d\n", row)) ;
	  KILL_ROW (row) ;
	}
	else
	{
	  /* save the new mark */
	  Row [row].shared2.mark = set_difference + tag_mark ;
	}
      }
    }


    /* === Add up set differences for each column ======================= */

    COLAMD_DEBUG3 (("** Adding set differences phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      /* get a column */
      col = *rp++ ;
      COLAMD_ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
      hash = 0 ;
      cur_score = 0 ;
      cp = &A [Col [col].start] ;
      /* compact the column */
      new_cp = cp ;
      cp_end = cp + Col [col].length ;

      COLAMD_DEBUG4 (("Adding set diffs for Col: %d.\n", col)) ;

      while (cp < cp_end)
      {
	/* get a row */
	row = *cp++ ;
	COLAMD_ASSERT(row >= 0 && row < n_row) ;
	row_mark = Row [row].shared2.mark ;
	/* skip if dead */
	if (ROW_IS_MARKED_DEAD (row_mark))
	{
	  continue ;
	}
	COLAMD_ASSERT (row_mark > tag_mark) ;
	/* compact the column */
	*new_cp++ = row ;
	/* compute hash function */
	hash += row ;
	/* add set difference */
	cur_score += row_mark - tag_mark ;
	/* integer overflow... */
	cur_score = COLAMD_MIN (cur_score, n_col) ;
      }

      /* recompute the column's length */
      Col [col].length = (Index) (new_cp - &A [Col [col].start]) ;

      /* === Further mass elimination ================================= */

      if (Col [col].length == 0)
      {
	COLAMD_DEBUG4 (("further mass elimination. Col: %d\n", col)) ;
	/* nothing left but the pivot row in this column */
	KILL_PRINCIPAL_COL (col) ;
	pivot_row_degree -= Col [col].shared1.thickness ;
	COLAMD_ASSERT (pivot_row_degree >= 0) ;
	/* order it */
	Col [col].shared2.order = k ;
	/* increment order count by column thickness */
	k += Col [col].shared1.thickness ;
      }
      else
      {
	/* === Prepare for supercolumn detection ==================== */

	COLAMD_DEBUG4 (("Preparing supercol detection for Col: %d.\n", col)) ;

	/* save score so far */
	Col [col].shared2.score = cur_score ;

	/* add column to hash table, for supercolumn detection */
	hash %= n_col + 1 ;

	COLAMD_DEBUG4 ((" Hash = %d, n_col = %d.\n", hash, n_col)) ;
	COLAMD_ASSERT (hash <= n_col) ;

	head_column = head [hash] ;
	if (head_column > COLAMD_EMPTY)
	{
	  /* degree list "hash" is non-empty, use prev (shared3) of */
	  /* first column in degree list as head of hash bucket */
	  first_col = Col [head_column].shared3.headhash ;
	  Col [head_column].shared3.headhash = col ;
	}
	else
	{
	  /* degree list "hash" is empty, use head as hash bucket */
	  first_col = - (head_column + 2) ;
	  head [hash] = - (col + 2) ;
	}
	Col [col].shared4.hash_next = first_col ;

	/* save hash function in Col [col].shared3.hash */
	Col [col].shared3.hash = (Index) hash ;
	COLAMD_ASSERT (COL_IS_ALIVE (col)) ;
      }
    }

    /* The approximate external column degree is now computed.  */

    /* === Supercolumn detection ======================================== */

    COLAMD_DEBUG3 (("** Supercolumn detection phase. **\n")) ;

    Eigen::internal::detect_super_cols (Col, A, head, pivot_row_start, pivot_row_length) ;

    /* === Kill the pivotal column ====================================== */

    KILL_PRINCIPAL_COL (pivot_col) ;

    /* === Clear mark =================================================== */

    tag_mark += (max_deg + 1) ;
    if (tag_mark >= max_mark)
    {
      COLAMD_DEBUG2 (("clearing tag_mark\n")) ;
      tag_mark = Eigen::internal::clear_mark (n_row, Row) ;
    }

    /* === Finalize the new pivot row, and column scores ================ */

    COLAMD_DEBUG3 (("** Finalize scores phase. **\n")) ;

    /* for each column in pivot row */
    rp = &A [pivot_row_start] ;
    /* compact the pivot row */
    new_rp = rp ;
    rp_end = rp + pivot_row_length ;
    while (rp < rp_end)
    {
      col = *rp++ ;
      /* skip dead columns */
      if (COL_IS_DEAD (col))
      {
	continue ;
      }
      *new_rp++ = col ;
      /* add new pivot row to column */
      A [Col [col].start + (Col [col].length++)] = pivot_row ;

      /* retrieve score so far and add on pivot row's degree. */
      /* (we wait until here for this in case the pivot */
      /* row's degree was reduced due to mass elimination). */
      cur_score = Col [col].shared2.score + pivot_row_degree ;

      /* calculate the max possible score as the number of */
      /* external columns minus the 'k' value minus the */
      /* columns thickness */
      max_score = n_col - k - Col [col].shared1.thickness ;

      /* make the score the external degree of the union-of-rows */
      cur_score -= Col [col].shared1.thickness ;

      /* make sure score is less or equal than the max score */
      cur_score = COLAMD_MIN (cur_score, max_score) ;
      COLAMD_ASSERT (cur_score >= 0) ;

      /* store updated score */
      Col [col].shared2.score = cur_score ;

      /* === Place column back in degree list ========================= */

      COLAMD_ASSERT (min_score >= 0) ;
      COLAMD_ASSERT (min_score <= n_col) ;
      COLAMD_ASSERT (cur_score >= 0) ;
      COLAMD_ASSERT (cur_score <= n_col) ;
      COLAMD_ASSERT (head [cur_score] >= COLAMD_EMPTY) ;
      next_col = head [cur_score] ;
      Col [col].shared4.degree_next = next_col ;
      Col [col].shared3.prev = COLAMD_EMPTY ;
      if (next_col != COLAMD_EMPTY)
      {
	Col [next_col].shared3.prev = col ;
      }
      head [cur_score] = col ;

      /* see if this score is less than current min */
      min_score = COLAMD_MIN (min_score, cur_score) ;

    }

    /* === Resurrect the new pivot row ================================== */

    if (pivot_row_degree > 0)
    {
      /* update pivot row length to reflect any cols that were killed */
      /* during super-col detection and mass elimination */
      Row [pivot_row].start  = pivot_row_start ;
      Row [pivot_row].length = (Index) (new_rp - &A[pivot_row_start]) ;
      Row [pivot_row].shared1.degree = pivot_row_degree ;
      Row [pivot_row].shared2.mark = 0 ;
      /* pivot row is no longer dead */
    }
  }

  /* === All principal columns have now been ordered ====================== */

  return (ngarbage) ;
}